

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::fix_up_interpolant_access_chain
          (CompilerMSL *this,uint32_t *ops,uint32_t length)

{
  bool bVar1;
  uint32_t value;
  SPIRVariable *var;
  size_type sVar2;
  SPIRType *pSVar3;
  SPIRType *type;
  SPIRConstant *pSVar4;
  SPIRType *type_00;
  CompilerError *this_00;
  uint32_t id;
  ulong uVar5;
  uint32_t local_34;
  
  var = Compiler::maybe_get_backing_variable((Compiler *)this,ops[2]);
  if (var != (SPIRVariable *)0x0) {
    local_34 = (var->super_IVariant).self.id;
    sVar2 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->pull_model_inputs)._M_h,&local_34);
    if (sVar2 != 0) {
      pSVar3 = Compiler::get_variable_data_type((Compiler *)this,var);
      type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*ops);
      bVar1 = Compiler::has_extended_decoration
                        ((Compiler *)this,ops[2],SPIRVCrossDecorationInterfaceMemberIndex);
      if (bVar1) {
        value = Compiler::get_extended_decoration
                          ((Compiler *)this,ops[2],SPIRVCrossDecorationInterfaceMemberIndex);
      }
      else {
        if (pSVar3->basetype != Struct) {
          __assert_fail("var_type.basetype == SPIRType::Struct",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x233a,
                        "void spirv_cross::CompilerMSL::fix_up_interpolant_access_chain(const uint32_t *, uint32_t)"
                       );
        }
        pSVar4 = Compiler::get<spirv_cross::SPIRConstant>
                           ((Compiler *)this,
                            ops[(pSVar3->array).super_VectorView<unsigned_int>.buffer_size + 3]);
        value = Compiler::get_extended_member_decoration
                          ((Compiler *)this,(var->super_IVariant).self.id,(pSVar4->m).c[0].r[0].u32,
                           SPIRVCrossDecorationInterfaceMemberIndex);
      }
      type_00 = pSVar3;
      for (uVar5 = 3; uVar5 < length; uVar5 = uVar5 + 1) {
        bVar1 = Compiler::is_vector((Compiler *)this,type_00);
        if (bVar1) {
          bVar1 = Compiler::is_array((Compiler *)this,type_00);
          if (!bVar1) {
            bVar1 = Compiler::is_scalar((Compiler *)this,type);
            if (bVar1) {
              Compiler::set_extended_decoration
                        ((Compiler *)this,ops[1],SPIRVCrossDecorationInterpolantComponentExpr,
                         ops[uVar5]);
              break;
            }
          }
        }
        pSVar4 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,ops[uVar5]);
        if ((pSVar4 == (SPIRConstant *)0x0) || (pSVar4->specialization == true)) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,
                     "Trying to dynamically index into an array interface variable using pull-model interpolation. This is currently unsupported."
                    );
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        id = (type_00->parent_type).id;
        if (id == 0) {
          if (type_00->basetype == Struct) {
            id = (type_00->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                 [(pSVar4->m).c[0].r[0].u32].id;
            goto LAB_001e0d6a;
          }
        }
        else {
LAB_001e0d6a:
          type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
        }
        bVar1 = Compiler::has_extended_decoration
                          ((Compiler *)this,ops[2],SPIRVCrossDecorationInterfaceMemberIndex);
        if ((bVar1) || (uVar5 - 3 != (pSVar3->array).super_VectorView<unsigned_int>.buffer_size)) {
          value = value + (pSVar4->m).c[0].r[0].u32;
        }
      }
      Compiler::set_extended_decoration
                ((Compiler *)this,ops[1],SPIRVCrossDecorationInterfaceMemberIndex,value);
    }
  }
  return;
}

Assistant:

void CompilerMSL::fix_up_interpolant_access_chain(const uint32_t *ops, uint32_t length)
{
	auto *var = maybe_get_backing_variable(ops[2]);
	if (!var || !pull_model_inputs.count(var->self))
		return;
	// Get the base index.
	uint32_t interface_index;
	auto &var_type = get_variable_data_type(*var);
	auto &result_type = get<SPIRType>(ops[0]);
	auto *type = &var_type;
	if (has_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex))
	{
		interface_index = get_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex);
	}
	else
	{
		// Assume an access chain into a struct variable.
		assert(var_type.basetype == SPIRType::Struct);
		auto &c = get<SPIRConstant>(ops[3 + var_type.array.size()]);
		interface_index =
		    get_extended_member_decoration(var->self, c.scalar(), SPIRVCrossDecorationInterfaceMemberIndex);
	}
	// Accumulate indices. We'll have to skip over the one for the struct, if present, because we already accounted
	// for that getting the base index.
	for (uint32_t i = 3; i < length; ++i)
	{
		if (is_vector(*type) && !is_array(*type) && is_scalar(result_type))
		{
			// We don't want to combine the next index. Actually, we need to save it
			// so we know to apply a swizzle to the result of the interpolation.
			set_extended_decoration(ops[1], SPIRVCrossDecorationInterpolantComponentExpr, ops[i]);
			break;
		}

		auto *c = maybe_get<SPIRConstant>(ops[i]);
		if (!c || c->specialization)
			SPIRV_CROSS_THROW("Trying to dynamically index into an array interface variable using pull-model "
			                  "interpolation. This is currently unsupported.");

		if (type->parent_type)
			type = &get<SPIRType>(type->parent_type);
		else if (type->basetype == SPIRType::Struct)
			type = &get<SPIRType>(type->member_types[c->scalar()]);

		if (!has_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex) &&
		    i - 3 == var_type.array.size())
			continue;

		interface_index += c->scalar();
	}
	// Save this to the access chain itself so we can recover it later when calling an interpolation function.
	set_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex, interface_index);
}